

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O1

void __thiscall
despot::MemoryPool<despot::POMDPXState>::NewChunk(MemoryPool<despot::POMDPXState> *this)

{
  pointer *pppCVar1;
  iterator __position;
  long lVar2;
  Chunk *chunk;
  Chunk *local_30;
  POMDPXState *local_28;
  
  local_30 = (Chunk *)operator_new(0x3800);
  lVar2 = 0;
  do {
    POMDPXState::POMDPXState
              ((POMDPXState *)((long)&local_30->Objects[0].super_State._vptr_State + lVar2));
    lVar2 = lVar2 + 0x38;
  } while (lVar2 != 0x3800);
  __position._M_current =
       (this->chunks_).
       super__Vector_base<despot::MemoryPool<despot::POMDPXState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::POMDPXState>::Chunk_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->chunks_).
      super__Vector_base<despot::MemoryPool<despot::POMDPXState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::POMDPXState>::Chunk_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<despot::MemoryPool<despot::POMDPXState>::Chunk*,std::allocator<despot::MemoryPool<despot::POMDPXState>::Chunk*>>
    ::_M_realloc_insert<despot::MemoryPool<despot::POMDPXState>::Chunk*const&>
              ((vector<despot::MemoryPool<despot::POMDPXState>::Chunk*,std::allocator<despot::MemoryPool<despot::POMDPXState>::Chunk*>>
                *)this,__position,&local_30);
  }
  else {
    *__position._M_current = local_30;
    pppCVar1 = &(this->chunks_).
                super__Vector_base<despot::MemoryPool<despot::POMDPXState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::POMDPXState>::Chunk_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppCVar1 = *pppCVar1 + 1;
  }
  lVar2 = 0x37c8;
  do {
    local_28 = (POMDPXState *)((long)&local_30->Objects[0].super_State._vptr_State + lVar2);
    std::vector<despot::POMDPXState*,std::allocator<despot::POMDPXState*>>::
    emplace_back<despot::POMDPXState*>
              ((vector<despot::POMDPXState*,std::allocator<despot::POMDPXState*>> *)&this->freelist_
               ,&local_28);
    (&local_30->Objects[0].super_State.super_MemoryObject)[lVar2].allocated_ = false;
    lVar2 = lVar2 + -0x38;
  } while (lVar2 != -0x38);
  return;
}

Assistant:

void NewChunk() {
		Chunk* chunk = new Chunk;
		chunks_.push_back(chunk);
		for (int i = Chunk::Size - 1; i >= 0; --i) {
			freelist_.push_back(&chunk->Objects[i]);
			chunk->Objects[i].ClearAllocated();
		}
	}